

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc1.c
# Opt level: O0

void mbc1_write(gb_cart *cart,uint16_t addr,uint8_t byte)

{
  int iVar1;
  byte *pbVar2;
  ushort uVar3;
  int local_24;
  int offset;
  mbc1_state_t *state;
  uint8_t byte_local;
  uint16_t addr_local;
  gb_cart *cart_local;
  
  if (cart == (gb_cart *)0x0) {
    __assert_fail("cart != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc1.c"
                  ,0x5b,"void mbc1_write(struct gb_cart *, uint16_t, uint8_t)");
  }
  pbVar2 = (byte *)cart->mbc_state;
  uVar3 = addr & 0xf000;
  if (((addr & 0xf000) == 0) || (uVar3 == 0x1000)) {
    *pbVar2 = (byte & 0xf) == 10;
  }
  else if ((uVar3 == 0x2000) || (uVar3 == 0x3000)) {
    cart->curr_rom_bank = cart->curr_rom_bank & 0xffffffe0U | byte & 0x1f;
    cart->curr_rom_bank = cart->curr_rom_bank % cart->rom_size;
    iVar1 = cart->curr_rom_bank;
    if (iVar1 == 0) {
      cart->curr_rom_bank = 1;
    }
    else if (iVar1 == 0x20) {
      cart->curr_rom_bank = 0x21;
    }
    else if (iVar1 == 0x40) {
      cart->curr_rom_bank = 0x41;
    }
    else if (iVar1 == 0x60) {
      cart->curr_rom_bank = 0x61;
    }
  }
  else if ((uVar3 == 0x4000) || (uVar3 == 0x5000)) {
    if ((pbVar2[1] & 1) == 0) {
      cart->curr_ram_bank = (uint)byte;
      cart->curr_ram_bank = cart->curr_ram_bank % cart->ram_size;
    }
    else {
      cart->curr_rom_bank = cart->curr_rom_bank & 0x1fU | (byte & 3) << 5;
      cart->curr_rom_bank = cart->curr_rom_bank % cart->rom_size;
      iVar1 = cart->curr_rom_bank;
      if (iVar1 == 0) {
        cart->curr_rom_bank = 1;
      }
      else if (iVar1 == 0x20) {
        cart->curr_rom_bank = 0x21;
      }
      else if (iVar1 == 0x40) {
        cart->curr_rom_bank = 0x41;
      }
      else if (iVar1 == 0x60) {
        cart->curr_rom_bank = 0x61;
      }
    }
  }
  else if ((uVar3 == 0x6000) || (uVar3 == 0x7000)) {
    pbVar2[1] = (byte & 1) != 0;
  }
  else if (((uVar3 == 0xa000) || (uVar3 == 0xb000)) && ((*pbVar2 & 1) != 0)) {
    local_24 = 0;
    if ((pbVar2[1] & 1) == 0) {
      local_24 = cart->curr_ram_bank << 0xd;
    }
    cart->ram[(int)(local_24 + (uint)addr + -0xa000)] = byte;
  }
  return;
}

Assistant:

void mbc1_write(struct gb_cart *cart, uint16_t addr, uint8_t byte)
{
    assert(cart != NULL);

    mbc1_state_t *state = (mbc1_state_t*)cart->mbc_state;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
        // RAM enable
        state->ram_enabled = (byte & 0xF) == 0xA;
        break;

    case 0x2000:
    case 0x3000:
        // ROM bank number
        cart->curr_rom_bank = (cart->curr_rom_bank & (~0x1F)) | (byte & 0x1F);
        cart->curr_rom_bank %= cart->rom_size;

        switch (cart->curr_rom_bank)
        {
        case 0x00:
            cart->curr_rom_bank = 0x01;
            break;
        
        case 0x20:
            cart->curr_rom_bank = 0x21;
            break;

        case 0x40:
            cart->curr_rom_bank = 0x41;
            break;

        case 0x60:
            cart->curr_rom_bank = 0x61;
            break;

        default:
            break;
        }

        break;

    case 0x4000:
    case 0x5000:
        //  RAM Bank Number (mode 0) or Upper Bits of ROM Bank Number (mode 1)
        if (state->second_mode)
        {
            cart->curr_rom_bank = (cart->curr_rom_bank & 0x1F) | ((byte & 0x3) << 5);
            cart->curr_rom_bank %= cart->rom_size;

            switch (cart->curr_rom_bank)
            {
            case 0x00:
                cart->curr_rom_bank = 0x01;
                break;
            
            case 0x20:
                cart->curr_rom_bank = 0x21;
                break;

            case 0x40:
                cart->curr_rom_bank = 0x41;
                break;

            case 0x60:
                cart->curr_rom_bank = 0x61;
                break;

            default:
                break;
            }
        }
        else
        {
            cart->curr_ram_bank = byte;
            cart->curr_ram_bank %= cart->ram_size;
        }

        break;

    case 0x6000:
    case 0x7000:
        // Mode switching
        state->second_mode = byte & 0x1;
        break;

    case 0xA000:
    case 0xB000:
        // External RAM
        if (state->ram_enabled)
        {
            int offset = 0;
            if (!state->second_mode)
                offset = cart->curr_ram_bank * SRAM_BANK_SIZE;

            cart->ram[offset + addr - 0xA000] = byte;
        }
        break;
    
    default:
        break;
    }
}